

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(const_chaiscript::Boxed_Number_&),_chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<unsigned_short>,_const_chaiscript::Boxed_Number_&>_>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(const_chaiscript::Boxed_Number_&),_chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<unsigned_short>,_const_chaiscript::Boxed_Number_&>_>
           *this)

{
  Proxy_Function_Base::~Proxy_Function_Base((Proxy_Function_Base *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~Proxy_Function_Callable_Impl() {}